

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picobench.hpp
# Opt level: O0

benchmarks_vector * __thiscall picobench::registry::benchmarks_for_current_suite(registry *this)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  value_type local_58;
  reference local_38;
  rsuite *s;
  iterator __end2;
  iterator __begin2;
  vector<picobench::rsuite,_std::allocator<picobench::rsuite>_> *__range2;
  registry *this_local;
  
  __end2 = std::vector<picobench::rsuite,_std::allocator<picobench::rsuite>_>::begin(&this->_suites)
  ;
  s = (rsuite *)
      std::vector<picobench::rsuite,_std::allocator<picobench::rsuite>_>::end(&this->_suites);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<picobench::rsuite_*,_std::vector<picobench::rsuite,_std::allocator<picobench::rsuite>_>_>
                                *)&s);
    if (!bVar1) {
      local_58.name = this->_current_suite_name;
      local_58.benchmarks.
      super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.benchmarks.
      super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.benchmarks.
      super__Vector_base<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>,_std::allocator<std::unique_ptr<picobench::benchmark_impl,_std::default_delete<picobench::benchmark_impl>_>_>_>
      ::vector(&local_58.benchmarks);
      std::vector<picobench::rsuite,_std::allocator<picobench::rsuite>_>::push_back
                (&this->_suites,&local_58);
      rsuite::~rsuite(&local_58);
      pvVar3 = std::vector<picobench::rsuite,_std::allocator<picobench::rsuite>_>::back
                         (&this->_suites);
      return &pvVar3->benchmarks;
    }
    local_38 = __gnu_cxx::
               __normal_iterator<picobench::rsuite_*,_std::vector<picobench::rsuite,_std::allocator<picobench::rsuite>_>_>
               ::operator*(&__end2);
    if (local_38->name == this->_current_suite_name) break;
    if (((local_38->name != (char *)0x0) && (this->_current_suite_name != (char *)0x0)) &&
       (iVar2 = strcmp(local_38->name,this->_current_suite_name), iVar2 == 0)) {
      return &local_38->benchmarks;
    }
    __gnu_cxx::
    __normal_iterator<picobench::rsuite_*,_std::vector<picobench::rsuite,_std::allocator<picobench::rsuite>_>_>
    ::operator++(&__end2);
  }
  return &local_38->benchmarks;
}

Assistant:

benchmarks_vector& benchmarks_for_current_suite()
    {
        for (auto& s : _suites)
        {
            if (s.name == _current_suite_name)
                return s.benchmarks;

            if (s.name && _current_suite_name && strcmp(s.name, _current_suite_name) == 0)
                return s.benchmarks;
        }
        _suites.push_back({ _current_suite_name, {} });
        return _suites.back().benchmarks;
    }